

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.hpp
# Opt level: O0

void __thiscall glu::VertexArrayPointer::VertexArrayPointer(VertexArrayPointer *this)

{
  VertexArrayPointer *this_local;
  
  this->componentType = VTX_COMP_TYPE_LAST;
  this->convert = VTX_COMP_CONVERT_LAST;
  this->numComponents = 0;
  this->numElements = 0;
  this->stride = 0;
  this->data = (void *)0x0;
  return;
}

Assistant:

VertexArrayPointer (void)
		: componentType	(VTX_COMP_TYPE_LAST)
		, convert		(VTX_COMP_CONVERT_LAST)
		, numComponents	(0)
		, numElements	(0)
		, stride		(0)
		, data			(0)
	{
	}